

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O1

char * sx_strchar(char *str,char ch)

{
  ulong *puVar1;
  ulong *puVar2;
  char *pcVar3;
  uint8_t *char_ptr;
  char cVar4;
  ulong uVar5;
  ulong *puVar6;
  
  if (((ulong)str & 7) != 0) {
    pcVar3 = str + 1;
    do {
      if ((char)*(ulong *)str == ch) {
        return (char *)(ulong *)str;
      }
      if ((char)*(ulong *)str == '\0') goto LAB_00107e1e;
      str = (char *)((long)str + 1);
      uVar5 = (ulong)pcVar3 & 7;
      pcVar3 = pcVar3 + 1;
    } while (uVar5 != 0);
  }
  puVar1 = (ulong *)str;
LAB_00107d24:
  do {
    puVar6 = (ulong *)str;
    uVar5 = *puVar6;
    if (((0x8101010101010100 - uVar5 ^ uVar5) & 0x8101010101010100) == 0) {
      uVar5 = uVar5 ^ (ulong)(byte)ch * 0x101010101010101;
      str = (char *)(puVar6 + 1);
      if (((0x8101010101010100 - uVar5 ^ uVar5) & 0x8101010101010100) == 0) goto LAB_00107d24;
    }
    cVar4 = '\x01';
    puVar2 = puVar6;
    if ((char)*puVar6 != ch) {
      puVar2 = puVar1;
      if ((char)*puVar6 == '\0') {
LAB_00107df3:
        cVar4 = '\x05';
      }
      else if (*(char *)((long)puVar6 + 1) == ch) {
        puVar2 = (ulong *)((long)puVar6 + 1);
      }
      else {
        if (*(char *)((long)puVar6 + 1) == '\0') goto LAB_00107df3;
        if (*(char *)((long)puVar6 + 2) == ch) {
          puVar2 = (ulong *)((long)puVar6 + 2);
        }
        else {
          if (*(char *)((long)puVar6 + 2) == '\0') goto LAB_00107df3;
          if (*(char *)((long)puVar6 + 3) == ch) {
            puVar2 = (ulong *)((long)puVar6 + 3);
          }
          else {
            if (*(char *)((long)puVar6 + 3) == '\0') goto LAB_00107df3;
            if (*(char *)((long)puVar6 + 4) == ch) {
              puVar2 = (ulong *)((long)puVar6 + 4);
            }
            else {
              if (*(char *)((long)puVar6 + 4) == '\0') goto LAB_00107df3;
              if (*(char *)((long)puVar6 + 5) == ch) {
                puVar2 = (ulong *)((long)puVar6 + 5);
              }
              else {
                if (*(char *)((long)puVar6 + 5) == '\0') goto LAB_00107df3;
                if (*(char *)((long)puVar6 + 6) == ch) {
                  puVar2 = (ulong *)((long)puVar6 + 6);
                }
                else {
                  if (*(char *)((long)puVar6 + 6) == '\0') goto LAB_00107df3;
                  if (*(char *)((long)puVar6 + 7) == ch) {
                    puVar2 = (ulong *)((long)puVar6 + 7);
                  }
                  else {
                    cVar4 = (*(char *)((long)puVar6 + 7) == '\0') * '\x05';
                  }
                }
              }
            }
          }
        }
      }
    }
    str = (char *)(puVar6 + 1);
    puVar1 = puVar2;
    if (cVar4 != '\0') {
      if (cVar4 == '\x05') {
LAB_00107e1e:
        puVar2 = (ulong *)0x0;
      }
      return (char *)puVar2;
    }
  } while( true );
}

Assistant:

const char* sx_strchar(const char* str, char ch)
{
    const uint8_t* char_ptr;
    uintptr_t* longword_ptr;
    uintptr_t longword, magic_bits, charmask;
    uint8_t c = (uint8_t)ch;

    // Handle the first few characters by reading one character at a time.
    // Do this until CHAR_PTR is aligned on a longword boundary.
    for (char_ptr = (const uint8_t*)str; ((uintptr_t)char_ptr & (sizeof(longword) - 1)) != 0;
         ++char_ptr) {
        if (*char_ptr == c)
            return (const char*)char_ptr;
        else if (*char_ptr == '\0')
            return NULL;
    }

    longword_ptr = (uintptr_t*)char_ptr;
    magic_bits = (uintptr_t)-1;
    magic_bits = magic_bits / 0xff * 0xfe << 1 >> 1 | 1;
    charmask = c | (c << 8);
    charmask |= charmask << 16;
#if SX_ARCH_64BIT
    charmask |= (charmask << 16) << 16;
#endif

    for (;;) {
        longword = *longword_ptr++;

        if ((((longword + magic_bits) ^ ~longword) & ~magic_bits) != 0 ||
            ((((longword ^ charmask) + magic_bits) ^ ~(longword ^ charmask)) & ~magic_bits) != 0) {
            const uint8_t* cp = (const uint8_t*)(longword_ptr - 1);

            if (*cp == c)
                return (const char*)cp;
            else if (*cp == '\0')
                break;
            if (*++cp == c)
                return (const char*)cp;
            else if (*cp == '\0')
                break;
            if (*++cp == c)
                return (const char*)cp;
            else if (*cp == '\0')
                break;
            if (*++cp == c)
                return (const char*)cp;
            else if (*cp == '\0')
                break;
#if SX_ARCH_64BIT
            if (*++cp == c)
                return (const char*)cp;
            else if (*cp == '\0')
                break;
            if (*++cp == c)
                return (const char*)cp;
            else if (*cp == '\0')
                break;
            if (*++cp == c)
                return (const char*)cp;
            else if (*cp == '\0')
                break;
            if (*++cp == c)
                return (const char*)cp;
            else if (*cp == '\0')
                break;
#endif
        }
    }

    return NULL;
}